

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void google::protobuf::internal::WriteVarint(uint64_t val,string *s)

{
  uint8_t c;
  string *s_local;
  uint64_t val_local;
  
  for (s_local = (string *)val; (string *)0x7f < s_local; s_local = (string *)((ulong)s_local >> 7))
  {
    std::__cxx11::string::push_back((char)s);
  }
  std::__cxx11::string::push_back((char)s);
  return;
}

Assistant:

inline void WriteVarint(uint64_t val, std::string* s) {
  while (val >= 128) {
    uint8_t c = val | 0x80;
    s->push_back(c);
    val >>= 7;
  }
  s->push_back(val);
}